

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

sexp sexp_xtype_exception(sexp ctx,sexp self,char *msg,sexp obj)

{
  sexp psVar1;
  char *in_RCX;
  sexp in_RDX;
  sexp in_RSI;
  sexp in_RDI;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp res;
  sexp_gc_var_t local_38;
  sexp_conflict slen;
  
  slen = (sexp_conflict)0x43e;
  memset(&local_38,0,0x10);
  local_38.var = (sexp_conflict *)&stack0xffffffffffffffd8;
  local_38.next = (in_RDI->value).context.saves;
  (in_RDI->value).context.saves = &local_38;
  sexp_c_string(in_RDX,in_RCX,(sexp_sint_t)slen);
  psVar1 = type_exception(res,(sexp)__sexp_gc_preserver1.next,(sexp)__sexp_gc_preserver1.var,in_RDI,
                          in_RSI);
  (in_RDI->value).context.saves = local_38.next;
  return psVar1;
}

Assistant:

sexp sexp_xtype_exception (sexp ctx, sexp self, const char *msg, sexp obj) {
  sexp_gc_var1(res);
  sexp_gc_preserve1(ctx, res);
  res = sexp_c_string(ctx, msg, -1);
  res = type_exception(ctx, self, res, obj, SEXP_FALSE);
  sexp_gc_release1(ctx);
  return res;
}